

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O2

int trie_insert(trie t,vector keys,trie_value value)

{
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  set_value pvVar4;
  trie_node parent;
  trie_value value_00;
  ulong position;
  
  iVar1 = 1;
  if (t != (trie)0x0) {
    sVar2 = vector_size(keys);
    parent = t->root;
    for (position = 0; (parent != (trie_node)0x0 && (position < sVar2)); position = position + 1) {
      puVar3 = (undefined8 *)vector_at(keys,position);
      if ((parent->childs == (set)0x0) ||
         ((pvVar4 = set_get(parent->childs,(set_key)*puVar3), pvVar4 == (set_value)0x0 ||
          (t->node_list == (trie_node)0x0)))) {
        value_00 = (trie_value)0x0;
        if (sVar2 - 1 == position) {
          value_00 = value;
        }
        parent = trie_node_insert(t,parent,(trie_key)*puVar3,value_00);
        if (parent == (trie_node)0x0) {
          log_write_impl_va("metacall",0x17b,"trie_insert",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_trie.c"
                            ,LOG_LEVEL_ERROR,"Trie invalid node insertion");
          return 1;
        }
      }
      else {
        parent = t->node_list + *(long *)((long)pvVar4 + 8);
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int trie_insert(trie t, vector keys, trie_value value)
{
	if (t != NULL)
	{
		size_t iterator, size = vector_size(keys);

		trie_node current_node = t->root;

		for (iterator = 0; current_node != NULL && iterator < size; ++iterator)
		{
			trie_key *key_ptr = vector_at(keys, iterator);

			trie_node next_node = NULL;

			if (current_node->childs != NULL)
			{
				trie_node_ref node_ref = set_get(current_node->childs, *key_ptr);

				if (node_ref != NULL)
				{
					next_node = &t->node_list[node_ref->index];
				}
			}

			if (next_node == NULL)
			{
				if (iterator == (size - 1))
				{
					next_node = trie_node_insert(t, current_node, *key_ptr, value);
				}
				else
				{
					next_node = trie_node_insert(t, current_node, *key_ptr, NULL);
				}

				if (next_node == NULL)
				{
					log_write("metacall", LOG_LEVEL_ERROR, "Trie invalid node insertion");

					return 1;
				}
			}

			current_node = next_node;
		}

		return 0;
	}

	return 1;
}